

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O0

void file_handle_reader_ops(FileHandlePool *fhp,int tracker)

{
  int iVar1;
  ts_nsec tVar2;
  ts_nsec tVar3;
  FileHandlePool *pFVar4;
  int in_ESI;
  fdb_iterator *in_RDI;
  ts_nsec endGet;
  ts_nsec beginGet;
  int i;
  fdb_file_info info;
  char bodybuf [256];
  char keybuf [256];
  size_t valuelen;
  void *value;
  ts_nsec end;
  ts_nsec begin;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  ts_nsec endSnap;
  ts_nsec beginSnap;
  int index;
  fdb_kvs_handle *snap_handle;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status status;
  undefined2 in_stack_fffffffffffffcd8;
  undefined2 in_stack_fffffffffffffcda;
  undefined4 in_stack_fffffffffffffcdc;
  uint64_t in_stack_fffffffffffffce0;
  fdb_iterator *in_stack_fffffffffffffce8;
  fdb_kvs_handle *in_stack_fffffffffffffcf0;
  fdb_file_handle **in_stack_fffffffffffffcf8;
  FileHandlePool *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  fdb_file_info *in_stack_fffffffffffffd10;
  fdb_kvs_handle *in_stack_fffffffffffffd18;
  fdb_doc **in_stack_fffffffffffffd50;
  fdb_iterator *in_stack_fffffffffffffd58;
  char local_278 [256];
  fdb_file_handle *local_178 [31];
  fdb_seqnum_t in_stack_ffffffffffffff80;
  fdb_kvs_handle **in_stack_ffffffffffffff88;
  fdb_kvs_handle *in_stack_ffffffffffffff90;
  fdb_iterator *local_48;
  ts_nsec local_40;
  ts_nsec local_38;
  int local_2c;
  fdb_kvs_handle *local_28;
  undefined8 local_20;
  undefined8 local_18;
  fdb_status local_10;
  int local_c;
  fdb_iterator *local_8;
  
  local_18 = 0;
  local_20 = 0;
  local_28 = (fdb_kvs_handle *)0x0;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_2c = FileHandlePool::getAvailableResource
                       (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                        (fdb_kvs_handle **)in_stack_fffffffffffffcf0);
  local_38 = get_monotonic_ts();
  local_10 = fdb_snapshot_open(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffff80);
  local_40 = get_monotonic_ts();
  if (local_10 != FDB_RESULT_SUCCESS) {
    fdb_assert_die((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                   (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                   (uint64_t)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  }
  ts_diff(local_38,local_40);
  FileHandlePool::collectStat
            ((FileHandlePool *)in_stack_fffffffffffffcf0,
             (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),in_stack_fffffffffffffce0);
  if (local_c % 100 == 0) {
    local_48 = (fdb_iterator *)0x0;
    tVar2 = get_monotonic_ts();
    in_stack_fffffffffffffcd8 = 0;
    in_stack_fffffffffffffcda = 0;
    local_10 = fdb_iterator_init(local_28,&local_48,(void *)0x0,0,(void *)0x0,0,0);
    tVar3 = get_monotonic_ts();
    if (local_10 != FDB_RESULT_SUCCESS) {
      fdb_assert_die((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                     (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    }
    ts_diff(tVar2,tVar3);
    FileHandlePool::collectStat
              ((FileHandlePool *)in_stack_fffffffffffffcf0,
               (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),in_stack_fffffffffffffce0);
    tVar2 = get_monotonic_ts();
    local_10 = fdb_iterator_get(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    tVar3 = get_monotonic_ts();
    if (local_10 == FDB_RESULT_SUCCESS) {
      fdb_doc_free((fdb_doc *)0x104bff);
      ts_diff(tVar2,tVar3);
      FileHandlePool::collectStat
                ((FileHandlePool *)in_stack_fffffffffffffcf0,
                 (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),in_stack_fffffffffffffce0);
    }
    else if (local_10 != FDB_RESULT_ITERATOR_FAIL) {
      fdb_assert_die((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                     (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    }
    tVar2 = get_monotonic_ts();
    local_10 = fdb_iterator_close(in_stack_fffffffffffffce8);
    tVar3 = get_monotonic_ts();
    if (local_10 != FDB_RESULT_SUCCESS) {
      fdb_assert_die((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                     (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    }
    ts_diff(tVar2,tVar3);
    FileHandlePool::collectStat
              ((FileHandlePool *)in_stack_fffffffffffffcf0,
               (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),in_stack_fffffffffffffce0);
  }
  else {
    local_10 = fdb_get_file_info((fdb_file_handle *)in_stack_fffffffffffffd18,
                                 in_stack_fffffffffffffd10);
    if (local_10 != FDB_RESULT_SUCCESS) {
      fdb_assert_die((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                     (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    }
    if (in_stack_fffffffffffffd50 == (fdb_doc **)0x0) {
      pFVar4 = (FileHandlePool *)0x0;
    }
    else {
      iVar1 = rand();
      pFVar4 = (FileHandlePool *)((ulong)(long)iVar1 % (ulong)in_stack_fffffffffffffd50);
    }
    in_stack_fffffffffffffd00 = pFVar4;
    sprintf((char *)local_178,"key%d",(ulong)pFVar4 & 0xffffffff);
    sprintf(local_278,"body%d",(ulong)pFVar4 & 0xffffffff);
    tVar2 = get_monotonic_ts();
    in_stack_fffffffffffffcf8 = local_178;
    in_stack_fffffffffffffcf0 = local_28;
    strlen((char *)local_178);
    local_10 = fdb_get_kv(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                          in_stack_fffffffffffffd08,&in_stack_fffffffffffffd00->_vptr_FileHandlePool
                          ,(size_t *)in_stack_fffffffffffffcf8);
    tVar3 = get_monotonic_ts();
    if (local_10 == FDB_RESULT_SUCCESS) {
      iVar1 = memcmp((void *)0x0,local_278,(size_t)in_stack_ffffffffffffff90);
      if (iVar1 != 0) {
        __assert_fail("memcmp(value, bodybuf, valuelen) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                      ,0x1e0,"void file_handle_reader_ops(FileHandlePool *, int)");
      }
      fdb_free_block((void *)0x104e83);
      ts_diff(tVar2,tVar3);
      FileHandlePool::collectStat
                ((FileHandlePool *)in_stack_fffffffffffffcf0,(int)((ulong)local_8 >> 0x20),
                 in_stack_fffffffffffffce0);
      in_stack_fffffffffffffce8 = local_8;
    }
    else if (local_10 != FDB_RESULT_KEY_NOT_FOUND) {
      fdb_assert_die((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                     (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    }
  }
  local_10 = fdb_kvs_close((fdb_kvs_handle *)
                           CONCAT44(in_stack_fffffffffffffcdc,
                                    CONCAT22(in_stack_fffffffffffffcda,in_stack_fffffffffffffcd8)));
  if (local_10 != FDB_RESULT_SUCCESS) {
    fdb_assert_die((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                   (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                   (uint64_t)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  }
  FileHandlePool::returnResourceToPool
            ((FileHandlePool *)in_stack_fffffffffffffcf0,
             (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  return;
}

Assistant:

void file_handle_reader_ops(FileHandlePool *fhp, int tracker) {
    fdb_status status;

    // Acquire handles from pool
    fdb_file_handle *dbfile = nullptr;
    fdb_kvs_handle *db = nullptr;
    fdb_kvs_handle *snap_handle = nullptr;
    const int index = fhp->getAvailableResource(&dbfile, &db);

    // Create an in-memory snapshot
    ts_nsec beginSnap = get_monotonic_ts();
    status = fdb_snapshot_open(db, &snap_handle, FDB_SNAPSHOT_INMEM);
    ts_nsec endSnap = get_monotonic_ts();
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    fhp->collectStat(IN_MEM_SNAP, ts_diff(beginSnap, endSnap));

    // Iterator ops using the snapshot handle once every 100 times
    if (tracker % 100 == 0) {
        fdb_iterator *iterator = nullptr;
        fdb_doc *rdoc = nullptr;
        ts_nsec begin, end;

        // Initialize iterator
        begin = get_monotonic_ts();
        status = fdb_iterator_init(snap_handle, &iterator,
                                   nullptr, 0, nullptr, 0,
                                   FDB_ITR_NONE);
        end = get_monotonic_ts();
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        fhp->collectStat(ITR_INIT, ts_diff(begin, end));

        // Get using iterator
        begin = get_monotonic_ts();
        status = fdb_iterator_get(iterator, &rdoc);
        end = get_monotonic_ts();
        if (status == FDB_RESULT_SUCCESS) {
            fdb_doc_free(rdoc);
            fhp->collectStat(ITR_GET, ts_diff(begin, end));
        } else {
            // Block not found, no keys available
            fdb_assert(status == FDB_RESULT_ITERATOR_FAIL,
                       status, FDB_RESULT_ITERATOR_FAIL);
        }

        // Close iterator
        begin = get_monotonic_ts();
        status = fdb_iterator_close(iterator);
        end = get_monotonic_ts();
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        fhp->collectStat(ITR_CLOSE, ts_diff(begin, end));
    } else {
        // Try fetching a random doc, using the snapshot handle
        void *value = nullptr;
        size_t valuelen;
        char keybuf[256], bodybuf[256];

        fdb_file_info info;
        status = fdb_get_file_info(dbfile, &info);
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
        int i = (info.doc_count > 0) ? rand() % info.doc_count : 0;

        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        ts_nsec beginGet = get_monotonic_ts();
        status = fdb_get_kv(snap_handle,
                            (void*)keybuf, strlen(keybuf) + 1,
                            &value, &valuelen);
        ts_nsec endGet = get_monotonic_ts();
        if (status == FDB_RESULT_SUCCESS) {
            assert(memcmp(value, bodybuf, valuelen) == 0);
            fdb_free_block(value);
            fhp->collectStat(GET, ts_diff(beginGet, endGet));
        } else { // If doc_count is zero
            fdb_assert(status == FDB_RESULT_KEY_NOT_FOUND,
                       status, FDB_RESULT_KEY_NOT_FOUND);
        }
    }

    // Close snapshot handle
    status = fdb_kvs_close(snap_handle);
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    // Return resource to pool
    fhp->returnResourceToPool(index);
}